

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void train_one(problem *prob,parameter *param,double *w,double Cp,double Cn)

{
  size_t __n;
  char cVar1;
  undefined4 uVar2;
  double *pdVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int *piVar9;
  undefined8 uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  double *pdVar14;
  l2r_l2_svr_fun *this;
  l2r_l2_svc_fun *this_00;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  void *pvVar18;
  void *__s;
  void *__dest;
  void *pvVar19;
  void *pvVar20;
  long lVar21;
  feature_node *pfVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  feature_node *pfVar30;
  ulong uVar31;
  int t_2;
  int iVar32;
  int iVar33;
  long lVar34;
  size_t sVar35;
  ulong uVar36;
  double dVar37;
  undefined8 in_XMM0_Qb;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double dVar57;
  double dVar58;
  double dVar59;
  TRON tron_obj;
  feature_node *x_space;
  double local_1f8;
  undefined1 local_1e8 [16];
  double local_1c0;
  uint local_16c;
  double local_150 [5];
  void *local_128;
  double local_120;
  undefined1 local_118 [40];
  void *local_f0;
  size_t local_e8;
  double local_e0;
  void *local_d8;
  void *local_d0;
  feature_node *local_c8;
  uint local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_80;
  double local_78;
  void *local_70;
  undefined1 local_68 [16];
  size_t local_50;
  undefined1 local_48 [16];
  
  auVar46._8_8_ = in_XMM0_Qb;
  auVar46._0_8_ = Cp;
  iVar11 = prob->l;
  lVar34 = (long)iVar11;
  if (lVar34 < 1) {
    iVar33 = 0;
  }
  else {
    lVar29 = 0;
    iVar33 = 0;
    do {
      iVar33 = iVar33 + (uint)(0.0 < prob->y[lVar29]);
      lVar29 = lVar29 + 1;
    } while (lVar34 != lVar29);
  }
  iVar24 = iVar11 - iVar33;
  if (iVar33 < iVar11 - iVar33) {
    iVar24 = iVar33;
  }
  iVar33 = 1;
  if (1 < iVar24) {
    iVar33 = iVar24;
  }
  local_150[3] = Cn;
  if (0xd < (uint)param->solver_type) {
switchD_00106947_caseD_4:
    train_one();
    return;
  }
  dVar37 = param->eps;
  auVar55._0_8_ = *(double *)(&DAT_0010c120 + (ulong)(param->init_sol == (double *)0x0) * 8);
  dVar43 = ((double)iVar33 * dVar37) / (double)iVar11;
  local_98 = auVar46;
  switch(param->solver_type) {
  case 0:
    uVar31 = 0xffffffffffffffff;
    if (-1 < iVar11) {
      uVar31 = lVar34 * 8;
    }
    pdVar14 = (double *)operator_new__(uVar31);
    if (0 < iVar11) {
      pdVar3 = prob->y;
      lVar29 = 0;
      do {
        uVar31 = -(ulong)(0.0 < pdVar3[lVar29]);
        pdVar14[lVar29] = (double)(~uVar31 & (ulong)local_150[3] | uVar31 & local_98._0_8_);
        lVar29 = lVar29 + 1;
      } while (lVar34 != lVar29);
    }
    this_00 = (l2r_l2_svc_fun *)operator_new(0x30);
    l2r_lr_fun::l2r_lr_fun((l2r_lr_fun *)this_00,prob,pdVar14);
    TRON::TRON((TRON *)local_118,(function *)this_00,dVar43,auVar55._0_8_,1000);
    TRON::set_print_string((TRON *)local_118,liblinear_print_string);
    TRON::tron((TRON *)local_118,w);
    break;
  case 1:
    iVar11 = 1;
    goto LAB_00107622;
  case 2:
    uVar31 = 0xffffffffffffffff;
    if (-1 < iVar11) {
      uVar31 = lVar34 << 3;
    }
    pdVar14 = (double *)operator_new__(uVar31);
    if (0 < iVar11) {
      pdVar3 = prob->y;
      lVar29 = 0;
      do {
        uVar31 = -(ulong)(0.0 < pdVar3[lVar29]);
        pdVar14[lVar29] = (double)(~uVar31 & (ulong)local_150[3] | uVar31 & local_98._0_8_);
        lVar29 = lVar29 + 1;
      } while (lVar34 != lVar29);
    }
    this_00 = (l2r_l2_svc_fun *)operator_new(0x40);
    l2r_l2_svc_fun::l2r_l2_svc_fun(this_00,prob,pdVar14);
    TRON::TRON((TRON *)local_118,(function *)this_00,dVar43,auVar55._0_8_,1000);
    TRON::set_print_string((TRON *)local_118,liblinear_print_string);
    TRON::tron((TRON *)local_118,w);
    break;
  case 3:
    iVar11 = 3;
LAB_00107622:
    solve_l2r_l1l2_svc(prob,w,dVar37,Cp,Cn,iVar11);
    return;
  default:
    goto switchD_00106947_caseD_4;
  case 5:
    local_c8 = (feature_node *)0x0;
    transpose(prob,&local_c8,(problem *)local_118);
    uVar27 = (ulong)(int)local_118._0_4_;
    lVar34 = (long)(int)local_118._4_4_;
    uVar31 = lVar34 * 4;
    __n = lVar34 * 8;
    if (lVar34 < 0) {
      uVar31 = 0xffffffffffffffff;
    }
    local_1e8._8_8_ = local_1e8._0_8_;
    local_1e8._0_8_ = __n;
    sVar35 = __n;
    if (lVar34 < 0) {
      sVar35 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar31);
    pvVar16 = operator_new__(uVar27);
    uVar31 = uVar27 * 8;
    if ((long)uVar27 < 0) {
      uVar31 = 0xffffffffffffffff;
    }
    pvVar17 = operator_new__(uVar31);
    pvVar18 = operator_new__(sVar35);
    uVar31 = (ulong)(uint)local_118._0_4_;
    local_150[0] = 0.0;
    local_150[1] = (double)local_98._0_8_;
    if (0 < lVar34) {
      memset(w,0,__n);
    }
    if (0 < (int)local_118._0_4_) {
      uVar27 = 0;
      do {
        *(undefined8 *)((long)pvVar17 + uVar27 * 8) = 0x3ff0000000000000;
        *(byte *)((long)pvVar16 + uVar27) = -(*(double *)(local_118._8_8_ + uVar27 * 8) <= 0.0) | 1;
        uVar27 = uVar27 + 1;
      } while (uVar31 != uVar27);
    }
    if (0 < (int)local_118._4_4_) {
      lVar29 = 0;
      do {
        *(int *)((long)pvVar15 + lVar29 * 4) = (int)lVar29;
        *(undefined8 *)((long)pvVar18 + lVar29 * 8) = 0;
        iVar11 = (*(feature_node **)(local_118._16_8_ + lVar29 * 8))->index;
        if (iVar11 != -1) {
          pdVar14 = &(*(feature_node **)(local_118._16_8_ + lVar29 * 8))->value;
          dVar37 = 0.0;
          do {
            lVar21 = (long)iVar11;
            cVar1 = *(char *)((long)pvVar16 + lVar21 + -1);
            auVar55._0_8_ = (double)(int)cVar1 * *pdVar14;
            *pdVar14 = auVar55._0_8_;
            *(double *)((long)pvVar17 + lVar21 * 8 + -8) =
                 *(double *)((long)pvVar17 + lVar21 * 8 + -8) - w[lVar29] * auVar55._0_8_;
            dVar37 = dVar37 + local_150[cVar1] * auVar55._0_8_ * auVar55._0_8_;
            *(double *)((long)pvVar18 + lVar29 * 8) = dVar37;
            iVar11 = *(int *)(pdVar14 + 1);
            pdVar14 = pdVar14 + 2;
          } while (iVar11 != -1);
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != lVar34);
    }
    lVar29 = uVar31 - 1;
    local_a8._8_4_ = (int)lVar29;
    local_a8._0_8_ = lVar29;
    local_a8._12_4_ = (int)((ulong)lVar29 >> 0x20);
    auVar55._0_8_ = -1.0;
    dVar44 = INFINITY;
    dVar50 = 0.0;
    uVar27 = (ulong)(uint)local_118._4_4_;
    dVar37 = (double)CONCAT44(local_b8._4_4_,(uint)local_b8);
    do {
      local_68._0_8_ = auVar55._0_8_;
      local_120 = dVar50;
      if (0 < (int)uVar27) {
        lVar29 = 0;
        uVar25 = uVar27;
        local_b8 = dVar37;
        do {
          iVar11 = rand();
          lVar21 = iVar11 % (int)uVar25 + lVar29;
          uVar2 = *(undefined4 *)((long)pvVar15 + lVar21 * 4);
          *(undefined4 *)((long)pvVar15 + lVar21 * 4) = *(undefined4 *)((long)pvVar15 + lVar29 * 4);
          *(undefined4 *)((long)pvVar15 + lVar29 * 4) = uVar2;
          lVar29 = lVar29 + 1;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
        auVar55._0_8_ = dVar44 / (double)(int)local_118._0_4_;
        dVar37 = -dVar44 / (double)(int)local_118._0_4_;
        local_b8._0_4_ = SUB84(dVar37,0);
        local_b8._4_4_ = (undefined4)((ulong)dVar37 >> 0x20);
        uStack_b0 = 0x8000000000000000;
        dVar44 = 0.0;
        iVar11 = 0;
        dVar47 = 0.0;
LAB_00106d06:
        iVar33 = *(int *)((long)pvVar15 + (long)iVar11 * 4);
        lVar29 = (long)iVar33;
        pfVar22 = *(feature_node **)(local_118._16_8_ + lVar29 * 8);
        iVar24 = pfVar22->index;
        if (iVar24 == -1) {
          dVar50 = 0.0;
          dVar48 = 0.0;
        }
        else {
          dVar50 = 0.0;
          dVar48 = 0.0;
          iVar28 = iVar24;
          pfVar30 = pfVar22;
          do {
            dVar49 = *(double *)((long)pvVar17 + (long)iVar28 * 8 + -8);
            if (0.0 < dVar49) {
              dVar57 = local_150[*(char *)((long)pvVar16 + (long)iVar28 + -1)] * pfVar30->value;
              dVar50 = dVar50 + pfVar30->value * dVar57;
              dVar48 = dVar48 + dVar49 * -dVar57;
            }
            iVar28 = pfVar30[1].index;
            pfVar30 = pfVar30 + 1;
          } while (iVar28 != -1);
          dVar50 = dVar50 + dVar50;
          dVar48 = dVar48 + dVar48;
        }
        if (dVar50 <= 1e-12) {
          dVar50 = 1e-12;
        }
        dVar51 = dVar48 + 1.0;
        dVar57 = dVar48 + -1.0;
        dVar49 = w[lVar29];
        if ((dVar49 != 0.0) || (NAN(dVar49))) {
          dVar45 = dVar57;
          if (0.0 < dVar49) {
            dVar45 = dVar51;
          }
          dVar45 = ABS(dVar45);
LAB_00106e29:
          if (dVar50 * dVar49 <= dVar51) {
            if (dVar57 <= dVar50 * dVar49) {
              dVar50 = -dVar49;
            }
            else {
              dVar50 = -dVar57 / dVar50;
            }
          }
          else {
            dVar50 = -dVar51 / dVar50;
          }
          if (dVar44 <= dVar45) {
            dVar44 = dVar45;
          }
          dVar47 = dVar47 + dVar45;
          if (1e-12 <= ABS(dVar50)) {
            dVar45 = dVar48 * dVar50 + (ABS(dVar49 + dVar50) - ABS(dVar49));
            dVar57 = *(double *)((long)pvVar18 + lVar29 * 8);
            pfVar22 = pfVar22 + 1;
            iVar28 = 0;
            iVar33 = iVar24;
            dVar51 = 0.0;
            do {
              dVar52 = dVar50;
              dVar51 = dVar51 - dVar52;
              dVar50 = dVar45 * -0.01 + (ABS(dVar49 + dVar52) - ABS(dVar49));
              if (dVar57 * dVar52 * dVar52 + dVar48 * dVar52 + dVar50 <= 0.0)
              goto joined_r0x0010721c;
              dVar58 = 0.0;
              if (iVar28 == 0) {
                if (iVar24 == -1) {
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = local_1e8._8_8_;
                  local_1e8 = auVar6 << 0x40;
                  iVar33 = -1;
                }
                else {
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = local_1e8._8_8_;
                  local_1e8 = auVar5 << 0x40;
                  pfVar30 = pfVar22;
                  iVar32 = iVar24;
                  do {
                    lVar21 = (long)iVar32;
                    dVar59 = *(double *)((long)pvVar17 + lVar21 * 8 + -8);
                    if (0.0 < dVar59) {
                      local_1e8._0_8_ =
                           (double)local_1e8._0_8_ +
                           local_150[*(char *)((long)pvVar16 + lVar21 + -1)] * dVar59 * dVar59;
                    }
                    dVar59 = pfVar30[-1].value * dVar51 + dVar59;
                    *(double *)((long)pvVar17 + lVar21 * 8 + -8) = dVar59;
                    if (0.0 < dVar59) {
                      dVar58 = dVar58 + local_150[*(char *)((long)pvVar16 + lVar21 + -1)] * dVar59 *
                                        dVar59;
                    }
                    iVar32 = pfVar30->index;
                    pfVar30 = pfVar30 + 1;
                    iVar33 = iVar24;
                  } while (iVar32 != -1);
                }
              }
              else {
                pfVar30 = pfVar22;
                iVar32 = iVar33;
                if (iVar33 == -1) {
                  iVar33 = -1;
                }
                else {
                  do {
                    lVar21 = (long)iVar32;
                    dVar59 = pfVar30[-1].value * dVar51 +
                             *(double *)((long)pvVar17 + lVar21 * 8 + -8);
                    *(double *)((long)pvVar17 + lVar21 * 8 + -8) = dVar59;
                    if (0.0 < dVar59) {
                      dVar58 = dVar58 + local_150[*(char *)((long)pvVar16 + lVar21 + -1)] * dVar59 *
                                        dVar59;
                    }
                    piVar9 = &pfVar30->index;
                    pfVar30 = pfVar30 + 1;
                    iVar32 = *piVar9;
                  } while (*piVar9 != -1);
                }
              }
              if ((dVar50 + dVar58) - (double)local_1e8._0_8_ <= 0.0) goto LAB_00107267;
              dVar45 = dVar45 * 0.5;
              iVar28 = iVar28 + 1;
              dVar50 = dVar52 * 0.5;
              dVar51 = dVar52;
            } while (iVar28 != 0x14);
            w[lVar29] = dVar49 + dVar52 * 0.5;
            local_b8 = dVar37;
            info("#");
            auVar46 = _DAT_0010c0c0;
            if (0 < (int)local_118._0_4_) {
              lVar29 = 0;
              auVar38 = _DAT_0010c0b0;
              do {
                auVar39 = local_a8 ^ auVar46;
                auVar40 = auVar38 ^ auVar46;
                bVar4 = auVar39._0_4_ < auVar40._0_4_;
                iVar33 = auVar39._4_4_;
                iVar24 = auVar40._4_4_;
                if ((bool)(~(iVar33 < iVar24 || iVar24 == iVar33 && bVar4) & 1)) {
                  *(undefined8 *)((long)pvVar17 + lVar29) = 0x3ff0000000000000;
                }
                if (iVar33 >= iVar24 && (iVar24 != iVar33 || !bVar4)) {
                  *(undefined8 *)((long)pvVar17 + lVar29 + 8) = 0x3ff0000000000000;
                }
                lVar21 = auVar38._8_8_;
                auVar38._0_8_ = auVar38._0_8_ + 2;
                auVar38._8_8_ = lVar21 + 2;
                lVar29 = lVar29 + 0x10;
              } while ((ulong)(local_118._0_4_ + 1 >> 1) << 4 != lVar29);
            }
            dVar37 = local_b8;
            if (0 < (int)local_118._4_4_) {
              lVar29 = 0;
              do {
                dVar50 = w[lVar29];
                if ((dVar50 != 0.0) || (NAN(dVar50))) {
                  iVar33 = (*(feature_node **)(local_118._16_8_ + lVar29 * 8))->index;
                  if (iVar33 != -1) {
                    pfVar22 = *(feature_node **)(local_118._16_8_ + lVar29 * 8);
                    do {
                      *(double *)((long)pvVar17 + (long)iVar33 * 8 + -8) =
                           pfVar22->value * -dVar50 +
                           *(double *)((long)pvVar17 + (long)iVar33 * 8 + -8);
                      iVar33 = pfVar22[1].index;
                      pfVar22 = pfVar22 + 1;
                    } while (iVar33 != -1);
                  }
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 != lVar34);
            }
          }
        }
        else {
          if (dVar51 < 0.0) {
            dVar45 = -dVar51;
            goto LAB_00106e29;
          }
          dVar45 = dVar57;
          if (((0.0 < dVar57) || (dVar45 = 0.0, dVar51 <= auVar55._0_8_)) || (dVar37 <= dVar57))
          goto LAB_00106e29;
          iVar24 = (int)uVar27;
          uVar27 = (ulong)(iVar24 - 1);
          *(undefined4 *)((long)pvVar15 + (long)iVar11 * 4) =
               *(undefined4 *)((long)pvVar15 + (long)iVar24 * 4 + -4);
          *(int *)((long)pvVar15 + (long)iVar24 * 4 + -4) = iVar33;
          iVar11 = iVar11 + -1;
        }
        goto LAB_00107288;
      }
      dVar47 = 0.0;
      dVar44 = 0.0;
LAB_001072b2:
      auVar55._0_8_ = dVar47;
      if (SUB84(local_120,0) != 0) {
        auVar55._0_8_ = (double)local_68._0_8_;
      }
      uVar13 = SUB84(local_120,0) + 1;
      dVar50 = (double)(ulong)uVar13;
      local_b8 = dVar37;
      if ((uVar13 * -0x33333333 >> 1 | (uint)((uVar13 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a
         ) {
        info(".");
      }
      dVar37 = local_120;
      if (dVar47 <= dVar43 * auVar55._0_8_) {
        if ((uint)uVar27 == local_118._4_4_) {
          info("\noptimization finished, #iter = %d\n",(ulong)uVar13);
          if (SUB84(dVar37,0) != 999) goto LAB_001085f8;
          goto LAB_001085ea;
        }
        info("*");
        dVar44 = INFINITY;
        uVar27 = (ulong)(uint)local_118._4_4_;
      }
      dVar37 = local_b8;
    } while (uVar13 != 1000);
    info("\noptimization finished, #iter = %d\n",1000);
LAB_001085ea:
    info("\nWARNING: reaching max number of iterations\n");
LAB_001085f8:
    if ((int)local_118._4_4_ < 1) {
      uVar13 = 0;
      dVar37 = 0.0;
    }
    else {
      lVar29 = 0;
      uVar13 = 0;
      auVar55._0_8_ = 0.0;
      do {
        iVar11 = (*(feature_node **)(local_118._16_8_ + lVar29 * 8))->index;
        if (iVar11 != -1) {
          pdVar14 = &(*(feature_node **)(local_118._16_8_ + lVar29 * 8))->value;
          do {
            *pdVar14 = *(double *)(local_118._8_8_ + ((long)iVar11 + -1) * 8) * *pdVar14;
            iVar11 = *(int *)(pdVar14 + 1);
            pdVar14 = pdVar14 + 2;
          } while (iVar11 != -1);
        }
        dVar43 = w[lVar29];
        dVar37 = ABS(dVar43) + auVar55._0_8_;
        if ((dVar43 == 0.0) && (!NAN(dVar43))) {
          dVar37 = auVar55._0_8_;
        }
        uVar13 = uVar13 + (dVar43 != 0.0);
        lVar29 = lVar29 + 1;
        auVar55._0_8_ = dVar37;
      } while (lVar29 != lVar34);
    }
    if (0 < (int)local_118._0_4_) {
      uVar27 = 0;
      do {
        auVar55._0_8_ = *(double *)((long)pvVar17 + uVar27 * 8);
        if (0.0 < auVar55._0_8_) {
          dVar37 = dVar37 + local_150[*(char *)((long)pvVar16 + uVar27)] * auVar55._0_8_ *
                            auVar55._0_8_;
        }
        uVar27 = uVar27 + 1;
      } while (uVar31 != uVar27);
    }
    info("Objective value = %lf\n",dVar37);
    info("#nonzeros/#features = %d/%d\n",(ulong)uVar13,(ulong)(uint)local_118._4_4_);
    operator_delete__(pvVar15);
    operator_delete__(pvVar16);
    operator_delete__(pvVar17);
    operator_delete__(pvVar18);
    if ((double *)local_118._8_8_ != (double *)0x0) {
      operator_delete__((void *)local_118._8_8_);
    }
    goto LAB_00108736;
  case 6:
    local_c8 = (feature_node *)0x0;
    transpose(prob,&local_c8,(problem *)local_118);
    uVar27 = (ulong)(int)local_118._0_4_;
    lVar34 = (long)(int)local_118._4_4_;
    uVar31 = lVar34 * 4;
    if (lVar34 < 0) {
      uVar31 = 0xffffffffffffffff;
    }
    uVar25 = lVar34 * 8;
    if (lVar34 < 0) {
      uVar25 = 0xffffffffffffffff;
    }
    pvVar15 = operator_new__(uVar31);
    pvVar16 = operator_new__(uVar27);
    local_d8 = operator_new__(uVar25);
    pvVar17 = operator_new__(uVar25);
    pvVar18 = operator_new__(uVar25);
    local_f0 = operator_new__(uVar25);
    uVar31 = uVar27 * 8;
    if ((long)uVar27 < 0) {
      uVar31 = 0xffffffffffffffff;
    }
    __s = operator_new__(uVar31);
    __dest = operator_new__(uVar31);
    local_128 = operator_new__(uVar31);
    pvVar19 = operator_new__(uVar31);
    pvVar20 = operator_new__(uVar31);
    uVar27 = (ulong)(uint)local_118._0_4_;
    uVar31 = (ulong)(uint)local_118._4_4_;
    local_150[0] = 0.0;
    local_150[1] = (double)local_98._0_8_;
    if (0 < lVar34) {
      memset(w,0,uVar31 * 8);
    }
    if (0 < (int)local_118._0_4_) {
      uVar25 = 0;
      do {
        *(byte *)((long)pvVar16 + uVar25) = -(*(double *)(local_118._8_8_ + uVar25 * 8) <= 0.0) | 1;
        *(undefined8 *)((long)__dest + uVar25 * 8) = 0;
        uVar25 = uVar25 + 1;
      } while (uVar27 != uVar25);
    }
    if ((int)local_118._4_4_ < 1) {
      local_1c0 = 0.0;
    }
    else {
      local_1c0 = 0.0;
      uVar25 = 0;
      do {
        dVar37 = w[uVar25];
        *(double *)((long)pvVar18 + uVar25 * 8) = dVar37;
        *(int *)((long)pvVar15 + uVar25 * 4) = (int)uVar25;
        *(undefined8 *)((long)local_f0 + uVar25 * 8) = 0;
        iVar11 = (*(feature_node **)(local_118._16_8_ + uVar25 * 8))->index;
        if (iVar11 != -1) {
          auVar55._0_8_ = 0.0;
          pfVar22 = *(feature_node **)(local_118._16_8_ + uVar25 * 8);
          do {
            lVar29 = (long)iVar11;
            dVar44 = pfVar22->value;
            *(double *)((long)__dest + lVar29 * 8 + -8) =
                 dVar37 * dVar44 + *(double *)((long)__dest + lVar29 * 8 + -8);
            if (*(char *)((long)pvVar16 + lVar29 + -1) == -1) {
              auVar55._0_8_ = auVar55._0_8_ + dVar44 * local_150[3];
              *(double *)((long)local_f0 + uVar25 * 8) = auVar55._0_8_;
            }
            iVar11 = pfVar22[1].index;
            pfVar22 = pfVar22 + 1;
          } while (iVar11 != -1);
        }
        local_1c0 = local_1c0 + ABS(dVar37);
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar31);
    }
    if (0 < (int)local_118._0_4_) {
      uVar25 = 0;
      do {
        auVar55._0_8_ = exp(*(double *)((long)__dest + uVar25 * 8));
        *(double *)((long)__dest + uVar25 * 8) = auVar55._0_8_;
        dVar44 = 1.0 / (auVar55._0_8_ + 1.0);
        dVar37 = local_150[*(char *)((long)pvVar16 + uVar25)];
        *(double *)((long)pvVar19 + uVar25 * 8) = dVar44 * dVar37;
        *(double *)((long)pvVar20 + uVar25 * 8) = auVar55._0_8_ * dVar37 * dVar44 * dVar44;
        uVar25 = uVar25 + 1;
      } while (uVar27 != uVar25);
    }
    local_78 = (double)(int)local_118._0_4_;
    local_e8 = uVar27 * 8;
    local_50 = uVar31 * 8;
    local_16c = 0;
    local_e0 = 1.0;
    dVar37 = INFINITY;
    auVar55._0_8_ = -1.0;
    local_d0 = pvVar15;
    local_70 = pvVar19;
LAB_001079de:
    dVar44 = 0.0;
    uVar10 = local_a8._8_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_a8._8_8_;
    local_a8 = auVar7 << 0x40;
    uVar13 = local_118._4_4_;
    if (0 < (int)local_118._4_4_) {
      dVar44 = 0.0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar10;
      local_a8 = auVar8 << 0x40;
      iVar11 = 0;
      do {
        iVar33 = *(int *)((long)pvVar15 + (long)iVar11 * 4);
        lVar29 = (long)iVar33;
        *(undefined8 *)((long)local_d8 + lVar29 * 8) = 0x3d719799812dea11;
        iVar24 = (*(feature_node **)(local_118._16_8_ + lVar29 * 8))->index;
        dVar50 = 0.0;
        if (iVar24 != -1) {
          dVar47 = 1e-12;
          dVar50 = 0.0;
          pfVar22 = *(feature_node **)(local_118._16_8_ + lVar29 * 8);
          do {
            dVar48 = pfVar22->value;
            dVar47 = dVar47 + *(double *)((long)pvVar20 + (long)iVar24 * 8 + -8) * dVar48 * dVar48;
            dVar50 = dVar50 + *(double *)((long)pvVar19 + (long)iVar24 * 8 + -8) * dVar48;
            *(double *)((long)local_d8 + lVar29 * 8) = dVar47;
            iVar24 = pfVar22[1].index;
            pfVar22 = pfVar22 + 1;
          } while (iVar24 != -1);
        }
        dVar50 = *(double *)((long)local_f0 + lVar29 * 8) - dVar50;
        *(double *)((long)pvVar17 + lVar29 * 8) = dVar50;
        dVar48 = dVar50 + 1.0;
        dVar50 = dVar50 + -1.0;
        dVar47 = w[lVar29];
        if ((dVar47 != 0.0) || (NAN(dVar47))) {
          if (dVar47 <= 0.0) {
            dVar47 = ABS(dVar50);
          }
          else {
            dVar47 = ABS(dVar48);
          }
LAB_00107b45:
          dVar50 = (double)local_a8._0_8_;
          if ((double)local_a8._0_8_ <= dVar47) {
            dVar50 = dVar47;
          }
          local_a8._0_8_ = dVar50;
          dVar44 = dVar44 + dVar47;
          iVar11 = iVar11 + 1;
        }
        else {
          if (dVar48 < 0.0) {
            dVar47 = -dVar48;
            goto LAB_00107b45;
          }
          dVar47 = dVar50;
          if (((0.0 < dVar50) || (dVar47 = 0.0, dVar48 <= dVar37 / local_78)) ||
             (-dVar37 / local_78 <= dVar50)) goto LAB_00107b45;
          lVar29 = (long)(int)uVar13;
          uVar13 = uVar13 - 1;
          *(undefined4 *)((long)pvVar15 + (long)iVar11 * 4) =
               *(undefined4 *)((long)pvVar15 + lVar29 * 4 + -4);
          *(int *)((long)pvVar15 + lVar29 * 4 + -4) = iVar33;
        }
      } while (iVar11 < (int)uVar13);
    }
    dVar37 = dVar44;
    if (local_16c != 0) {
      dVar37 = auVar55._0_8_;
    }
    if (dVar43 * dVar37 < dVar44) {
      local_80 = dVar37;
      if (0 < (int)local_118._0_4_) {
        memset(__s,0,local_e8);
      }
      dVar37 = local_e0 * local_80;
      uVar25 = (ulong)uVar13;
      local_1e8._0_8_ = INFINITY;
      uVar12 = 0;
      do {
        if ((int)uVar25 < 1) {
          auVar55._0_8_ = 0.0;
          local_1e8._0_8_ = 0.0;
        }
        else {
          lVar29 = 0;
          uVar36 = uVar25;
          local_b8 = dVar37;
          do {
            iVar11 = rand();
            lVar21 = iVar11 % (int)uVar36 + lVar29;
            uVar2 = *(undefined4 *)((long)pvVar15 + lVar21 * 4);
            *(undefined4 *)((long)pvVar15 + lVar21 * 4) =
                 *(undefined4 *)((long)pvVar15 + lVar29 * 4);
            *(undefined4 *)((long)pvVar15 + lVar29 * 4) = uVar2;
            lVar29 = lVar29 + 1;
            uVar36 = uVar36 - 1;
          } while (uVar36 != 0);
          dVar44 = (double)local_1e8._0_8_ / local_78;
          dVar50 = -(double)local_1e8._0_8_;
          auVar55._0_8_ = 0.0;
          local_1e8._0_8_ = 0.0;
          iVar11 = 0;
          do {
            iVar33 = *(int *)((long)pvVar15 + (long)iVar11 * 4);
            lVar29 = (long)iVar33;
            dVar37 = *(double *)((long)local_d8 + lVar29 * 8);
            pfVar22 = *(feature_node **)(local_118._16_8_ + lVar29 * 8);
            dVar47 = *(double *)((long)pvVar18 + lVar29 * 8);
            dVar48 = (dVar47 - w[lVar29]) * 1e-12 + *(double *)((long)pvVar17 + lVar29 * 8);
            iVar24 = pfVar22->index;
            pfVar30 = pfVar22;
            iVar28 = iVar24;
            while (iVar28 != -1) {
              dVar48 = dVar48 + pfVar30->value * *(double *)((long)pvVar20 + (long)iVar28 * 8 + -8)
                                * *(double *)((long)__s + (long)iVar28 * 8 + -8);
              iVar28 = pfVar30[1].index;
              pfVar30 = pfVar30 + 1;
            }
            dVar49 = dVar48 + 1.0;
            dVar48 = dVar48 + -1.0;
            if ((dVar47 != 0.0) || (NAN(dVar47))) {
              dVar57 = dVar48;
              if (0.0 < dVar47) {
                dVar57 = dVar49;
              }
              dVar57 = ABS(dVar57);
LAB_00107dab:
              if (dVar37 * dVar47 <= dVar49) {
                if (dVar48 <= dVar37 * dVar47) {
                  dVar37 = -dVar47;
                }
                else {
                  dVar37 = -dVar48 / dVar37;
                }
              }
              else {
                dVar37 = -dVar49 / dVar37;
              }
              if ((double)local_1e8._0_8_ <= dVar57) {
                local_1e8._0_8_ = dVar57;
              }
              auVar55._0_8_ = auVar55._0_8_ + dVar57;
              if (1e-12 <= ABS(dVar37)) {
                if (dVar37 <= -10.0) {
                  dVar37 = -10.0;
                }
                if (10.0 <= dVar37) {
                  dVar37 = 10.0;
                }
                *(double *)((long)pvVar18 + lVar29 * 8) = dVar47 + dVar37;
                while (iVar24 != -1) {
                  *(double *)((long)__s + (long)iVar24 * 8 + -8) =
                       pfVar22->value * dVar37 + *(double *)((long)__s + (long)iVar24 * 8 + -8);
                  iVar24 = pfVar22[1].index;
                  pfVar22 = pfVar22 + 1;
                }
              }
            }
            else {
              if (dVar49 < 0.0) {
                dVar57 = -dVar49;
                goto LAB_00107dab;
              }
              dVar57 = dVar48;
              if (((0.0 < dVar48) || (dVar57 = 0.0, dVar49 <= dVar44)) ||
                 (dVar50 / local_78 <= dVar48)) goto LAB_00107dab;
              iVar24 = (int)uVar25;
              uVar25 = (ulong)(iVar24 - 1);
              *(undefined4 *)((long)pvVar15 + (long)iVar11 * 4) =
                   *(undefined4 *)((long)pvVar15 + (long)iVar24 * 4 + -4);
              *(int *)((long)pvVar15 + (long)iVar24 * 4 + -4) = iVar33;
              iVar11 = iVar11 + -1;
            }
            iVar11 = iVar11 + 1;
            dVar37 = local_b8;
          } while (iVar11 < (int)uVar25);
        }
        local_b8._4_4_ = (undefined4)((ulong)dVar37 >> 0x20);
        uVar23 = uVar12 + 1;
        if (auVar55._0_8_ <= dVar37) {
          local_1e8._0_8_ = INFINITY;
          uVar26 = (uint)uVar25;
          uVar25 = (ulong)uVar13;
          if (uVar26 == uVar13) {
            if (uVar12 != 999) goto LAB_00107edf;
            break;
          }
        }
        uVar12 = uVar23;
      } while (uVar23 != 1000);
      local_b8 = dVar37;
      info("WARNING: reaching max number of inner iterations\n");
      uVar12 = 999;
      uVar23 = 1000;
LAB_00107edf:
      dVar37 = 0.0;
      auVar55._0_8_ = 0.0;
      local_48 = ZEXT816(0);
      if (0 < (int)local_118._4_4_) {
        local_48 = ZEXT816(0);
        uVar25 = 0;
        do {
          dVar44 = *(double *)((long)pvVar18 + uVar25 * 8);
          auVar55._0_8_ =
               auVar55._0_8_ + (dVar44 - w[uVar25]) * *(double *)((long)pvVar17 + uVar25 * 8);
          auVar41._0_8_ = (ulong)(ABS(dVar44) + local_48._0_8_) & -(ulong)(dVar44 != 0.0);
          auVar41._8_8_ = 0;
          auVar53._0_8_ = ~-(ulong)(dVar44 != 0.0) & (ulong)local_48._0_8_;
          auVar53._8_8_ = local_48._8_8_;
          local_48 = auVar53 | auVar41;
          uVar25 = uVar25 + 1;
        } while (uVar31 != uVar25);
      }
      if (0 < (int)local_118._0_4_) {
        dVar37 = 0.0;
        uVar25 = 0;
        do {
          if (*(char *)((long)pvVar16 + uVar25) == -1) {
            dVar37 = dVar37 + *(double *)((long)__s + uVar25 * 8) * local_150[3];
          }
          uVar25 = uVar25 + 1;
        } while (uVar27 != uVar25);
      }
      auVar56._0_8_ = auVar55._0_8_ + (local_48._0_8_ - local_1c0);
      auVar56._8_8_ = 0;
      uVar13 = 0;
      local_bc = uVar23;
LAB_00107fa2:
      pvVar15 = local_128;
      auVar55._8_8_ = auVar56._8_8_;
      auVar55._0_8_ = auVar56._0_8_ * -0.01 + (local_48._0_8_ - local_1c0) + dVar37;
      local_120 = dVar37;
      local_b8._0_4_ = uVar13;
      local_68 = auVar56;
      if (0 < (int)local_118._0_4_) {
        uVar25 = 0;
        do {
          dVar44 = exp(*(double *)((long)__s + uVar25 * 8));
          dVar50 = *(double *)((long)__dest + uVar25 * 8) * dVar44;
          *(double *)((long)pvVar15 + uVar25 * 8) = dVar50;
          dVar37 = local_150[*(char *)((long)pvVar16 + uVar25)];
          dVar44 = log((dVar50 + 1.0) / (dVar44 + dVar50));
          auVar55._0_8_ = auVar55._0_8_ + dVar44 * dVar37;
          auVar55._8_8_ = 0;
          uVar25 = uVar25 + 1;
        } while (uVar27 != uVar25);
      }
      pvVar19 = local_70;
      if (0.0 < auVar55._0_8_) goto code_r0x00108078;
      if (0 < (int)local_118._4_4_) {
        memcpy(w,pvVar18,local_50);
      }
      pvVar15 = local_d0;
      if (0 < (int)local_118._0_4_) {
        memcpy(__dest,local_128,local_e8);
        uVar25 = 0;
        do {
          dVar37 = *(double *)((long)local_128 + uVar25 * 8);
          dVar44 = 1.0 / (dVar37 + 1.0);
          auVar55._0_8_ = local_150[*(char *)((long)pvVar16 + uVar25)];
          *(double *)((long)pvVar19 + uVar25 * 8) = dVar44 * auVar55._0_8_;
          *(double *)((long)pvVar20 + uVar25 * 8) = dVar37 * auVar55._0_8_ * dVar44 * dVar44;
          uVar25 = uVar25 + 1;
        } while (uVar27 != uVar25);
      }
      if (0x13 < (uint)local_b8) goto LAB_00108273;
      goto LAB_00108322;
    }
    goto LAB_001083e1;
  case 7:
    solve_l2r_lr_dual(prob,w,dVar37,Cp,Cn);
    return;
  case 0xb:
    uVar31 = 0xffffffffffffffff;
    if (-1 < iVar11) {
      uVar31 = lVar34 * 8;
    }
    pdVar14 = (double *)operator_new__(uVar31);
    auVar46 = _DAT_0010c0c0;
    if (0 < iVar11) {
      dVar37 = param->C;
      lVar34 = lVar34 + -1;
      auVar40._8_4_ = (int)lVar34;
      auVar40._0_8_ = lVar34;
      auVar40._12_4_ = (int)((ulong)lVar34 >> 0x20);
      lVar34 = 0;
      auVar40 = auVar40 ^ _DAT_0010c0c0;
      auVar39 = _DAT_0010c0b0;
      do {
        auVar55 = auVar39 ^ auVar46;
        if ((bool)(~(auVar55._4_4_ == auVar40._4_4_ && auVar40._0_4_ < auVar55._0_4_ ||
                    auVar40._4_4_ < auVar55._4_4_) & 1)) {
          *(double *)((long)pdVar14 + lVar34) = dVar37;
        }
        if ((auVar55._12_4_ != auVar40._12_4_ || auVar55._8_4_ <= auVar40._8_4_) &&
            auVar55._12_4_ <= auVar40._12_4_) {
          *(double *)((long)pdVar14 + lVar34 + 8) = dVar37;
        }
        lVar29 = auVar39._8_8_;
        auVar39._0_8_ = auVar39._0_8_ + 2;
        auVar39._8_8_ = lVar29 + 2;
        lVar34 = lVar34 + 0x10;
      } while ((ulong)(iVar11 + 1U >> 1) << 4 != lVar34);
    }
    this = (l2r_l2_svr_fun *)operator_new(0x48);
    l2r_l2_svr_fun::l2r_l2_svr_fun(this,prob,pdVar14,param->p);
    TRON::TRON((TRON *)local_118,(function *)this,param->eps,0.1,1000);
    TRON::set_print_string((TRON *)local_118,liblinear_print_string);
    TRON::tron((TRON *)local_118,w);
    (*(this->super_l2r_l2_svc_fun).super_function._vptr_function[5])(this);
    goto LAB_001075f4;
  case 0xc:
    iVar11 = 0xc;
    goto LAB_001078b0;
  case 0xd:
    iVar11 = 0xd;
LAB_001078b0:
    solve_l2r_l1l2_svr(prob,w,param,iVar11);
    return;
  }
  (*(this_00->super_function)._vptr_function[5])(this_00);
LAB_001075f4:
  operator_delete__(pdVar14);
  TRON::~TRON((TRON *)local_118);
  return;
code_r0x00108078:
  if ((int)local_118._4_4_ < 1) {
    local_48 = ZEXT816(0);
  }
  else {
    local_48 = ZEXT816(0);
    uVar25 = 0;
    do {
      dVar37 = (w[uVar25] + *(double *)((long)pvVar18 + uVar25 * 8)) * 0.5;
      *(double *)((long)pvVar18 + uVar25 * 8) = dVar37;
      auVar42._0_8_ = (ulong)(ABS(dVar37) + local_48._0_8_) & -(ulong)(dVar37 != 0.0);
      auVar42._8_8_ = 0;
      auVar54._0_8_ = ~-(ulong)(dVar37 != 0.0) & (ulong)local_48._0_8_;
      auVar54._8_8_ = local_48._8_8_;
      local_48 = auVar54 | auVar42;
      uVar25 = uVar25 + 1;
    } while (uVar31 != uVar25);
  }
  if (0 < (int)local_118._0_4_) {
    uVar25 = 0;
    do {
      *(double *)((long)__s + uVar25 * 8) = *(double *)((long)__s + uVar25 * 8) * 0.5;
      uVar25 = uVar25 + 1;
    } while (uVar27 != uVar25);
  }
  auVar56._0_8_ = (double)local_68._0_8_ * 0.5;
  auVar56._8_8_ = local_68._8_8_;
  dVar37 = local_120 * 0.5;
  uVar13 = (uint)local_b8 + 1;
  if (uVar13 == 0x14) goto code_r0x00108171;
  goto LAB_00107fa2;
code_r0x00108171:
  local_48._8_8_ = 0;
  local_48._0_8_ = local_1c0;
  pvVar15 = local_d0;
LAB_00108273:
  if (0 < (int)local_118._0_4_) {
    memset(__dest,0,local_e8);
  }
  if (0 < (int)local_118._4_4_) {
    uVar25 = 0;
    do {
      dVar37 = w[uVar25];
      if ((dVar37 != 0.0) || (NAN(dVar37))) {
        iVar11 = (*(feature_node **)(local_118._16_8_ + uVar25 * 8))->index;
        pfVar22 = *(feature_node **)(local_118._16_8_ + uVar25 * 8);
        while (iVar11 != -1) {
          *(double *)((long)__dest + (long)iVar11 * 8 + -8) =
               pfVar22->value * dVar37 + *(double *)((long)__dest + (long)iVar11 * 8 + -8);
          iVar11 = pfVar22[1].index;
          pfVar22 = pfVar22 + 1;
        }
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar31);
  }
  if (0 < (int)local_118._0_4_) {
    uVar25 = 0;
    do {
      dVar37 = exp(*(double *)((long)__dest + uVar25 * 8));
      *(double *)((long)__dest + uVar25 * 8) = dVar37;
      uVar25 = uVar25 + 1;
    } while (uVar27 != uVar25);
  }
LAB_00108322:
  uVar13 = local_bc;
  if (uVar12 == 0) {
    uVar13 = 1;
  }
  dVar44 = local_e0 * 0.25;
  if (uVar12 != 0) {
    dVar44 = local_e0;
  }
  local_16c = local_16c + 1;
  info("iter %3d  #CD cycles %d\n",(ulong)local_16c,(ulong)uVar13);
  local_1c0 = (double)local_48._0_8_;
  dVar37 = (double)local_a8._0_8_;
  auVar55._0_8_ = local_80;
  local_e0 = dVar44;
  if (local_16c == 100) goto code_r0x001083dc;
  goto LAB_001079de;
joined_r0x0010721c:
  while (iVar33 != -1) {
    *(double *)((long)pvVar17 + (long)iVar33 * 8 + -8) =
         pfVar22[-1].value * dVar51 + *(double *)((long)pvVar17 + (long)iVar33 * 8 + -8);
    piVar9 = &pfVar22->index;
    pfVar22 = pfVar22 + 1;
    iVar33 = *piVar9;
  }
LAB_00107267:
  w[lVar29] = dVar49 + dVar52;
LAB_00107288:
  iVar11 = iVar11 + 1;
  if ((int)uVar27 <= iVar11) goto LAB_001072b2;
  goto LAB_00106d06;
code_r0x001083dc:
  local_16c = 100;
LAB_001083e1:
  uVar13 = 0;
  info("=========================\n");
  info("optimization finished, #iter = %d\n",(ulong)local_16c);
  if (99 < local_16c) {
    info("WARNING: reaching max number of iterations\n");
  }
  if ((int)local_118._4_4_ < 1) {
    dVar37 = 0.0;
  }
  else {
    uVar25 = 0;
    uVar13 = 0;
    dVar37 = 0.0;
    do {
      auVar55._0_8_ = w[uVar25];
      dVar43 = ABS(auVar55._0_8_) + dVar37;
      if ((auVar55._0_8_ == 0.0) && (!NAN(auVar55._0_8_))) {
        dVar43 = dVar37;
      }
      dVar37 = dVar43;
      uVar13 = uVar13 + (auVar55._0_8_ != 0.0);
      uVar25 = uVar25 + 1;
    } while (uVar31 != uVar25);
  }
  if (0 < (int)local_118._0_4_) {
    uVar31 = 0;
    do {
      if ((long)*(char *)((long)pvVar16 + uVar31) == 1) {
        auVar55._0_8_ = 1.0 / *(double *)((long)__dest + uVar31 * 8);
        local_1f8 = (double)local_98._0_8_;
      }
      else {
        local_1f8 = local_150[*(char *)((long)pvVar16 + uVar31)];
        auVar55._0_8_ = *(double *)((long)__dest + uVar31 * 8);
      }
      auVar55._0_8_ = log(auVar55._0_8_ + 1.0);
      dVar37 = dVar37 + auVar55._0_8_ * local_1f8;
      uVar31 = uVar31 + 1;
    } while (uVar27 != uVar31);
  }
  info("Objective value = %lf\n",dVar37);
  info("#nonzeros/#features = %d/%d\n",(ulong)uVar13,lVar34);
  operator_delete__(pvVar15);
  operator_delete__(pvVar16);
  operator_delete__(local_d8);
  operator_delete__(pvVar17);
  operator_delete__(pvVar18);
  operator_delete__(local_f0);
  operator_delete__(__s);
  operator_delete__(__dest);
  operator_delete__(local_128);
  operator_delete__(pvVar19);
  operator_delete__(pvVar20);
  if ((double *)local_118._8_8_ != (double *)0x0) {
    operator_delete__((void *)local_118._8_8_);
  }
LAB_00108736:
  if ((feature_node **)local_118._16_8_ != (feature_node **)0x0) {
    operator_delete__((void *)local_118._16_8_);
  }
  if (local_c8 == (feature_node *)0x0) {
    return;
  }
  operator_delete__(local_c8);
  return;
}

Assistant:

static void train_one(const problem *prob, const parameter *param, double *w, double Cp, double Cn)
{
	//inner and outer tolerances for TRON
	double eps = param->eps;
	double eps_cg = 0.1;
	if(param->init_sol != NULL)
		eps_cg = 0.5;

	int pos = 0;
	int neg = 0;
	for(int i=0;i<prob->l;i++)
		if(prob->y[i] > 0)
			pos++;
	neg = prob->l - pos;
	double primal_solver_tol = eps*max(min(pos,neg), 1)/prob->l;

	function *fun_obj=NULL;
	switch(param->solver_type)
	{
		case L2R_LR:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
			{
				if(prob->y[i] > 0)
					C[i] = Cp;
				else
					C[i] = Cn;
			}
			fun_obj=new l2r_lr_fun(prob, C);
			TRON tron_obj(fun_obj, primal_solver_tol, eps_cg);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;
		}
		case L2R_L2LOSS_SVC:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
			{
				if(prob->y[i] > 0)
					C[i] = Cp;
				else
					C[i] = Cn;
			}
			fun_obj=new l2r_l2_svc_fun(prob, C);
			TRON tron_obj(fun_obj, primal_solver_tol, eps_cg);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;
		}
		case L2R_L2LOSS_SVC_DUAL:
			solve_l2r_l1l2_svc(prob, w, eps, Cp, Cn, L2R_L2LOSS_SVC_DUAL);
			break;
		case L2R_L1LOSS_SVC_DUAL:
			solve_l2r_l1l2_svc(prob, w, eps, Cp, Cn, L2R_L1LOSS_SVC_DUAL);
			break;
		case L1R_L2LOSS_SVC:
		{
			problem prob_col;
			feature_node *x_space = NULL;
			transpose(prob, &x_space ,&prob_col);
			solve_l1r_l2_svc(&prob_col, w, primal_solver_tol, Cp, Cn);
			delete [] prob_col.y;
			delete [] prob_col.x;
			delete [] x_space;
			break;
		}
		case L1R_LR:
		{
			problem prob_col;
			feature_node *x_space = NULL;
			transpose(prob, &x_space ,&prob_col);
			solve_l1r_lr(&prob_col, w, primal_solver_tol, Cp, Cn);
			delete [] prob_col.y;
			delete [] prob_col.x;
			delete [] x_space;
			break;
		}
		case L2R_LR_DUAL:
			solve_l2r_lr_dual(prob, w, eps, Cp, Cn);
			break;
		case L2R_L2LOSS_SVR:
		{
			double *C = new double[prob->l];
			for(int i = 0; i < prob->l; i++)
				C[i] = param->C;

			fun_obj=new l2r_l2_svr_fun(prob, C, param->p);
			TRON tron_obj(fun_obj, param->eps);
			tron_obj.set_print_string(liblinear_print_string);
			tron_obj.tron(w);
			delete fun_obj;
			delete[] C;
			break;

		}
		case L2R_L1LOSS_SVR_DUAL:
			solve_l2r_l1l2_svr(prob, w, param, L2R_L1LOSS_SVR_DUAL);
			break;
		case L2R_L2LOSS_SVR_DUAL:
			solve_l2r_l1l2_svr(prob, w, param, L2R_L2LOSS_SVR_DUAL);
			break;
		default:
			fprintf(stderr, "ERROR: unknown solver_type\n");
			break;
	}
}